

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall leveldb::log::_Test_UnexpectedMiddleType::_Run(_Test_UnexpectedMiddleType *this)

{
  allocator local_599;
  string local_598 [32];
  undefined1 local_578 [448];
  size_t local_3b8;
  int local_3ac;
  Tester local_3a8;
  undefined1 local_208 [471];
  allocator local_31;
  string local_30 [32];
  _Test_UnexpectedMiddleType *local_10;
  _Test_UnexpectedMiddleType *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"foo",&local_31);
  LogTest::Write(&this->super_LogTest,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  LogTest::SetByte(&this->super_LogTest,6,'\x03');
  LogTest::FixChecksum(&this->super_LogTest,0,3);
  test::Tester::Tester
            ((Tester *)(local_208 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1a8);
  LogTest::Read_abi_cxx11_((LogTest *)local_208);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)(local_208 + 0x20),(char (*) [4])"EOF",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
  std::__cxx11::string::~string((string *)local_208);
  test::Tester::~Tester((Tester *)(local_208 + 0x20));
  test::Tester::Tester
            (&local_3a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1a9);
  local_3ac = 3;
  local_3b8 = LogTest::DroppedBytes(&this->super_LogTest);
  test::Tester::IsEq<int,unsigned_long>(&local_3a8,&local_3ac,&local_3b8);
  test::Tester::~Tester(&local_3a8);
  test::Tester::Tester
            ((Tester *)(local_578 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1aa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"missing start",&local_599);
  LogTest::MatchError((LogTest *)local_578,(string *)this);
  test::Tester::IsEq<char[3],std::__cxx11::string>
            ((Tester *)(local_578 + 0x20),(char (*) [3])"OK",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578);
  std::__cxx11::string::~string((string *)local_578);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  test::Tester::~Tester((Tester *)(local_578 + 0x20));
  return;
}

Assistant:

TEST(LogTest, UnexpectedMiddleType) {
  Write("foo");
  SetByte(6, kMiddleType);
  FixChecksum(0, 3);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("missing start"));
}